

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask2_16(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 2 | *out;
  *out = in[2] << 4 | *out;
  *out = in[3] << 6 | *out;
  *out = in[4] << 8 | *out;
  *out = in[5] << 10 | *out;
  *out = in[6] << 0xc | *out;
  *out = in[7] << 0xe | *out;
  *out = in[8] << 0x10 | *out;
  *out = in[9] << 0x12 | *out;
  *out = in[10] << 0x14 | *out;
  *out = in[0xb] << 0x16 | *out;
  *out = in[0xc] << 0x18 | *out;
  *out = in[0xd] << 0x1a | *out;
  *out = in[0xe] << 0x1c | *out;
  *out = in[0xf] << 0x1e | *out;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask2_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 26;
  ++in;
  *out |= ((*in)) << 28;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  ++in;

  return out;
}